

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-inl.h
# Opt level: O2

void heap_insert(heap *heap,heap_node *newnode,heap_compare_fn less_than)

{
  int iVar1;
  bool bVar2;
  int local_3c;
  uint local_38;
  uint k;
  uint n;
  uint path;
  heap_node **child;
  heap_node **parent;
  heap_compare_fn less_than_local;
  heap_node *newnode_local;
  heap *heap_local;
  
  newnode->left = (heap_node *)0x0;
  newnode->right = (heap_node *)0x0;
  newnode->parent = (heap_node *)0x0;
  k = 0;
  local_3c = 0;
  for (local_38 = heap->nelts + 1; _n = (heap_node *)heap, child = &heap->min, 1 < local_38;
      local_38 = local_38 >> 1) {
    k = k << 1 | local_38 & 1;
    local_3c = local_3c + 1;
  }
  for (; local_3c != 0; local_3c = local_3c + -1) {
    child = &_n->left;
    if ((k & 1) == 0) {
      _n = _n->left;
    }
    else {
      _n = (heap_node *)&_n->left->right;
    }
    k = k >> 1;
  }
  newnode->parent = *child;
  _n->left = newnode;
  heap->nelts = heap->nelts + 1;
  while( true ) {
    bVar2 = false;
    if (newnode->parent != (heap_node *)0x0) {
      iVar1 = (*less_than)(newnode,newnode->parent);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    heap_node_swap(heap,newnode->parent,newnode);
  }
  return;
}

Assistant:

HEAP_EXPORT(void heap_insert(struct heap* heap,
                             struct heap_node* newnode,
                             heap_compare_fn less_than)) {
  struct heap_node** parent;
  struct heap_node** child;
  unsigned int path;
  unsigned int n;
  unsigned int k;

  newnode->left = NULL;
  newnode->right = NULL;
  newnode->parent = NULL;

  /* Calculate the path from the root to the insertion point.  This is a min
   * heap so we always insert at the left-most free node of the bottom row.
   */
  path = 0;
  for (k = 0, n = 1 + heap->nelts; n >= 2; k += 1, n /= 2)
    path = (path << 1) | (n & 1);

  /* Now traverse the heap using the path we calculated in the previous step. */
  parent = child = &heap->min;
  while (k > 0) {
    parent = child;
    if (path & 1)
      child = &(*child)->right;
    else
      child = &(*child)->left;
    path >>= 1;
    k -= 1;
  }

  /* Insert the new node. */
  newnode->parent = *parent;
  *child = newnode;
  heap->nelts += 1;

  /* Walk up the tree and check at each node if the heap property holds.
   * It's a min heap so parent < child must be true.
   */
  while (newnode->parent != NULL && less_than(newnode, newnode->parent))
    heap_node_swap(heap, newnode->parent, newnode);
}